

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDictionary.cpp
# Opt level: O0

bool IDictionary::isBaseType(string *str)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  string *local_2b0;
  int local_208;
  int i_1;
  _Self local_1f8;
  string local_1f0 [36];
  int local_1cc;
  string local_1c8 [4];
  int i;
  string tempStr;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_19f;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_19e;
  undefined1 local_19d;
  int maxLen;
  allocator local_198;
  allocator local_197;
  allocator local_196;
  allocator local_195 [20];
  allocator local_181;
  string *local_180;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  baseTypes;
  string *str_local;
  
  local_19d = 1;
  local_180 = local_178;
  baseTypes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"int",&local_181);
  local_180 = local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"float",local_195);
  local_180 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"double",&local_196);
  local_180 = local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"short",&local_197);
  local_180 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"unsigned",&local_198);
  local_180 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"struct",(allocator *)((long)&maxLen + 3));
  local_180 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"enum",(allocator *)((long)&maxLen + 2));
  local_180 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"char",(allocator *)((long)&maxLen + 1));
  local_180 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"bool",(allocator *)&maxLen);
  local_19d = 0;
  local_58 = (iterator)local_178;
  local_50 = 9;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_19f);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_48,__l,&local_19e,&local_19f);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_19f);
  local_2b0 = (string *)&local_58;
  do {
    local_2b0 = local_2b0 + -0x20;
    std::__cxx11::string::~string(local_2b0);
  } while (local_2b0 != local_178);
  std::allocator<char>::~allocator((allocator<char> *)&maxLen);
  std::allocator<char>::~allocator((allocator<char> *)((long)&maxLen + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&maxLen + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&maxLen + 3));
  std::allocator<char>::~allocator((allocator<char> *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_197);
  std::allocator<char>::~allocator((allocator<char> *)&local_196);
  std::allocator<char>::~allocator((allocator<char> *)local_195);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  iVar2 = std::__cxx11::string::length();
  std::__cxx11::string::string(local_1c8,(string *)str);
  for (local_1cc = 0; local_1cc <= iVar2; local_1cc = local_1cc + 1) {
    std::__cxx11::string::substr((ulong)local_1f0,(ulong)str);
    std::__cxx11::string::operator=(local_1c8,local_1f0);
    std::__cxx11::string::~string(local_1f0);
    local_1f8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48,(key_type *)local_1c8);
    _i_1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
    bVar1 = std::operator!=(&local_1f8,(_Self *)&i_1);
    if (bVar1) break;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_208 = std::__cxx11::string::length();
    do {
      local_208 = local_208 + 1;
      if (iVar2 <= local_208) {
        str_local._7_1_ = true;
        goto LAB_0010566e;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)str);
      bVar1 = isBlankSep(*pcVar4);
    } while ((bVar1) ||
            (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar4 == '*'));
    str_local._7_1_ = false;
  }
  else {
    str_local._7_1_ = false;
  }
LAB_0010566e:
  std::__cxx11::string::~string(local_1c8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_48);
  return str_local._7_1_;
}

Assistant:

bool IDictionary::isBaseType(std::string str) {
    std::set<std::string> baseTypes({"int","float","double","short","unsigned","struct","enum","char","bool"});
    int maxLen = str.length();
    std::string tempStr =str;

    for(int i=0;i<=maxLen;i++)
    {
        tempStr=str.substr(0,maxLen-i);
        if(baseTypes.find(tempStr)!=baseTypes.end())
            break;
    }
    if(tempStr.empty())
        return false;

    for(int i=tempStr.length()+1;i<maxLen;i++)
    {
        if(!(isBlankSep(str[i])||str[i]=='*'))
            return false;
    }
    return true;
}